

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

Environment * __thiscall testing::UnitTest::AddEnvironment(UnitTest *this,Environment *env)

{
  Environment *local_18;
  Environment *env_local;
  
  if (env == (Environment *)0x0) {
    local_18 = (Environment *)0x0;
  }
  else {
    local_18 = env;
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::push_back
              (&this->impl_->environments_,&local_18);
  }
  return local_18;
}

Assistant:

Environment* UnitTest::AddEnvironment(Environment* env) {
  if (env == nullptr) {
    return nullptr;
  }

  impl_->environments().push_back(env);
  return env;
}